

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_utils.c
# Opt level: O1

int64_t rml_encode_key(char *key,int64_t prime_number)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  sVar1 = strlen(key);
  if ((long)sVar1 < 1) {
    lVar2 = 1;
  }
  else {
    lVar3 = 1;
    uVar5 = 0;
    lVar2 = 1;
    lVar4 = 1;
    lVar6 = 1;
    do {
      uVar8 = (ulong)(byte)key[uVar5];
      lVar3 = lVar3 + uVar8;
      uVar7 = 0;
      if ((uVar5 & 1) == 0) {
        uVar7 = uVar8;
      }
      lVar6 = lVar6 + uVar7;
      uVar7 = 0;
      if ((int)uVar5 == (int)((uVar5 & 0xffffffff) / 3) * 3) {
        uVar7 = uVar8;
      }
      lVar4 = lVar4 + uVar7;
      if ((uVar5 & 3) != 0) {
        uVar8 = 0;
      }
      lVar2 = lVar2 + uVar8;
      uVar5 = uVar5 + 1;
    } while (sVar1 != uVar5);
    lVar2 = lVar2 * lVar3 * lVar4 * lVar6;
  }
  return lVar2 % prime_number;
}

Assistant:

int64_t rml_encode_key(char *key, int64_t prime_number) {
    int64_t length = strlen(key);
    int64_t code1 = 1;
    int64_t code2 = 1;
    int64_t code3 = 1;
    int64_t code4 = 1;
    uint8_t current = 0;
    for (int i = 0; i < length; ++i) {
        current = key[i];
        code1 += current;
        if (i % 2 == 0) {
            code2 += current;
        }
        if (i % 3 == 0) {
            code3 += current;
        }
        if (i % 4 == 0) {
            code4 += current;
        }
    }
    int64_t code = (code1 * code2 * code3 * code4) % prime_number;
    return code;
}